

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcSocket.cpp
# Opt level: O1

int XmlRpc::XmlRpcSocket::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  socklen_t __len_00;
  sockaddr_in6 *address;
  sockaddr_storage ss;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  address = (sockaddr_in6 *)local_88;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_88._16_8_ = 0;
  local_88._24_8_ = 0;
  local_88._8_8_ = 0;
  if (s_use_ipv6_) {
    local_88._0_2_ = 10;
    local_88._8_8_ = _in6addr_any;
    local_88._16_8_ = _pthread_rwlock_wrlock;
    __len_00 = 0x1c;
  }
  else {
    local_88._0_2_ = 2;
    __len_00 = 0x10;
  }
  local_88._2_2_ = (ushort)__addr << 8 | (ushort)__addr >> 8;
  local_88._4_4_ = 0;
  iVar1 = ::bind(__fd,(sockaddr *)address,__len_00);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
}

Assistant:

bool
XmlRpcSocket::bind(int fd, int port)
{
  sockaddr_storage ss;
  socklen_t ss_len;
  memset(&ss, 0, sizeof(ss));

  if (s_use_ipv6_)
  {
    sockaddr_in6 *address = (sockaddr_in6 *)&ss;
    ss_len = sizeof(sockaddr_in6);

    address->sin6_family = AF_INET6;
    address->sin6_addr = in6addr_any;
    address->sin6_port = htons((u_short) port);
  }
  else
  {
    sockaddr_in *address = (sockaddr_in *)&ss;
    ss_len = sizeof(sockaddr_in);

    address->sin_family = AF_INET;
    address->sin_addr.s_addr = htonl(INADDR_ANY);
    address->sin_port = htons((u_short) port);
  }

  return (::bind(fd, (sockaddr*)&ss, ss_len) == 0);
}